

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O0

void __thiscall
OpenMD::BondAngleDistribution::BondAngleDistribution
          (BondAngleDistribution *this,SimInfo *info,string *filename,string *sele,double rCut,
          int nbins)

{
  undefined1 uVar1;
  ostream *this_00;
  StaticAnalyser *this_01;
  string *params_00;
  string *in_RCX;
  SimInfo *in_RDX;
  SelectionManager *in_RSI;
  string *in_RDI;
  size_type in_XMM0_Qa;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffd38;
  StaticAnalyser *in_stack_fffffffffffffd40;
  SimInfo *in_stack_fffffffffffffd48;
  StaticAnalyser *in_stack_fffffffffffffd50;
  SelectionManager *this_02;
  undefined7 in_stack_fffffffffffffd58;
  string *this_03;
  allocator<char> *__a;
  SelectionEvaluator *this_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_05;
  SelectionEvaluator *this_06;
  string local_268 [32];
  stringstream local_248 [16];
  ostream local_238 [112];
  SimInfo *in_stack_fffffffffffffe38;
  SelectionEvaluator *in_stack_fffffffffffffe40;
  string local_a8 [32];
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [56];
  size_type local_28;
  string *local_20;
  
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,(string *)in_stack_fffffffffffffd40
             ,(uint)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  *(undefined ***)in_RDI = &PTR__BondAngleDistribution_0055e790;
  this_06 = (SelectionEvaluator *)&in_RDI[6].field_2;
  std::__cxx11::string::string((string *)this_06,local_20);
  this_05 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI[7].field_2;
  SelectionManager::SelectionManager(in_RSI,in_RDX);
  this_04 = (SelectionEvaluator *)(in_RDI[0xd].field_2._M_local_buf + 8);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  this_03 = in_RDI + 0x39;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13a341);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13a357);
  __a = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_05,(char *)this_04,__a);
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  getPrefix((string *)in_stack_fffffffffffffd48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  SelectionEvaluator::loadScriptString(this_06,in_RDI);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)((long)&in_RDI[0xd].field_2 + 8));
  if (!(bool)uVar1) {
    this_02 = (SelectionManager *)&in_RDI[7].field_2;
    SelectionEvaluator::evaluate(this_04);
    SelectionManager::setSelectionSet(this_02,(SelectionSet *)in_stack_fffffffffffffd48);
    SelectionSet::~SelectionSet((SelectionSet *)0x13a49f);
  }
  in_RDI[0x38]._M_string_length = local_28;
  std::__cxx11::stringstream::stringstream(local_248);
  this_00 = std::operator<<(local_238," rcut = ");
  this_01 = (StaticAnalyser *)
            std::ostream::operator<<(this_00,(double)in_RDI[0x38]._M_string_length);
  params_00 = (string *)std::operator<<((ostream *)this_01,", nbins = ");
  std::ostream::operator<<(params_00,*(int *)((long)&in_RDI[0x38].field_2 + 4));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_01,params_00);
  *(double *)((long)&in_RDI[0x38].field_2 + 8) =
       180.0 / (double)*(int *)((long)&in_RDI[0x38].field_2 + 4);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_03,CONCAT17(uVar1,in_stack_fffffffffffffd58))
  ;
  std::__cxx11::string::~string(local_268);
  std::__cxx11::stringstream::~stringstream(local_248);
  return;
}

Assistant:

BondAngleDistribution::BondAngleDistribution(SimInfo* info,
                                               const string& filename,
                                               const string& sele, double rCut,
                                               int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setAnalysisType("Bond Angle Distribution");
    setOutputName(getPrefix(filename) + ".bad");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius:

    rCut_ = rCut;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    // Theta can take values from 0 to 180

    deltaTheta_ = (180.0) / nBins_;
    histogram_.resize(nBins_);
  }